

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.c
# Opt level: O3

void rtranspose(double *m,int rows,int cols,double *n,int r,int c)

{
  bool bVar1;
  ulong uVar2;
  double *pdVar3;
  ulong uVar4;
  int iVar5;
  double dVar6;
  
  bVar1 = rows < 0x41;
  if (!bVar1 || 0x40 < cols) {
    do {
      while (cols < rows) {
        dVar6 = ceil((double)rows * 0.5);
        iVar5 = (int)dVar6;
        rows = rows - iVar5;
        rtranspose(m,iVar5,cols,n,r,c);
        m = m + iVar5 * c;
        n = n + iVar5;
        bVar1 = rows < 0x41;
        if ((rows < 0x41) && (cols < 0x41)) goto LAB_0011b045;
      }
      dVar6 = ceil((double)cols * 0.5);
      iVar5 = (int)dVar6;
      cols = cols - iVar5;
      rtranspose(m,rows,iVar5,n,r,c);
      m = m + iVar5;
      n = n + iVar5 * r;
    } while (!(bool)(bVar1 & cols < 0x41));
  }
LAB_0011b045:
  if (0 < rows) {
    uVar2 = 0;
    do {
      if (0 < cols) {
        uVar4 = 0;
        pdVar3 = n;
        do {
          *pdVar3 = m[uVar4];
          uVar4 = uVar4 + 1;
          pdVar3 = pdVar3 + r;
        } while ((uint)cols != uVar4);
      }
      uVar2 = uVar2 + 1;
      n = n + 1;
      m = m + c;
    } while (uVar2 != (uint)rows);
  }
  return;
}

Assistant:

void rtranspose(double *m, int rows, int cols,double *n, int r, int c) {
	register int i,j;
	int rm,cm;
	int rm1,cm1,rm2,cm2;
	int block;

	block = (int) BLOCKSIZE;

	if (rows <= block && cols <= block) {
		for (i = 0; i < rows; ++i) {
			for (j = 0; j < cols; ++j) {
				n[i+j*r] = m[j+i*c];
				//cout << *(n+i+j*r) << " ";
			}
		}
		//cout << endl;

	} else if (cols >= rows) {
		rm = rows;
		cm1 = (int) ceil((double) cols/2.0);
		cm2 = cols - cm1;

		rtranspose(m,rm,cm1,n,r,c);
		rtranspose(m+cm1,rm,cm2,n+cm1*r,r,c);
	} else if (rows > cols) {
		rm1 = (int) ceil((double) rows/2.0);
		rm2 = rows - rm1;
		cm = cols;
		rtranspose(m,rm1,cm,n,r,c);
		rtranspose(m+rm1*c,rm2,cm,n+rm1,r,c);
	}

}